

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O1

void operator_delete(void *p)

{
  PagemapEntry *entry;
  ushort uVar1;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this;
  unsigned_long uVar2;
  void *pvVar3;
  void **ppvVar4;
  BackendSlabMetadata *meta;
  ulong uVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 *puVar9;
  long lVar10;
  Array<uint16_t,_false___2_:_(true___1_:_0)> *pAVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  undefined8 *in_FS_OFFSET;
  bool bVar16;
  
  this = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
         *in_FS_OFFSET;
  uVar8 = (ulong)p >> 10 & 0xfffffffffffffff0;
  entry = (PagemapEntry *)
          ((long)&((snmalloc::
                    BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                    ::concretePagemap.body)->
                  super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                  ).super_MetaEntryBase.meta + uVar8);
  uVar8 = *(ulong *)((long)&((snmalloc::
                              BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                              ::concretePagemap.body)->
                            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                            ).super_MetaEntryBase.remote_and_sizeclass + uVar8);
  puVar9 = (undefined1 *)(uVar8 & 0xffffffffffffff80);
  if (&this->remote_alloc ==
      (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)puVar9) {
    meta = (BackendSlabMetadata *)
           ((entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta & 0xfffffffffffffffe);
    *(meta->
     super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
     ).free_queue.end._M_elems[0] = p;
    (meta->
    super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
    ).free_queue.end._M_elems[0] = (void **)p;
    puVar9 = &(meta->
              super_FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
              ).free_queue.field_0x12;
    *(short *)puVar9 = *(short *)puVar9 + -1;
    if (*(short *)puVar9 == 0) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this,(Alloc<void>)p,entry,meta);
      return;
    }
  }
  else if (puVar9 != (undefined1 *)0x0) {
    lVar7 = (this->remote_dealloc_cache).capacity;
    lVar10 = lVar7 - *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar8 & 0x7f) << 5));
    if (lVar10 == 0 || lVar7 < *(long *)(snmalloc::sizeclass_metadata + (((uint)uVar8 & 0x7f) << 5))
       ) {
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_remote_slow<snmalloc::CheckInitPthread>(this,entry,(Alloc<void>)p);
      return;
    }
    (this->remote_dealloc_cache).capacity = lVar10;
    uVar8 = (entry->
            super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
            ).super_MetaEntryBase.meta;
    if (p == (void *)0x0) {
      p = (void **)0x0;
    }
    else {
      *(undefined8 *)p = 0;
    }
    uVar5 = uVar8 & 0xfffffffffffffffe;
    uVar8 = (ulong)(((uint)(uVar8 >> 3) & 0x1fffffff) * 0x3352d >> 0x10 & 7);
    pAVar11 = &(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar8].length;
    lVar7 = 0;
    do {
      if (uVar5 == (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar8 + lVar7]) {
        *((Array<void_**,_LENGTH> *)(pAVar11 + -4))->_M_elems[0] = p;
        ((Array<void_**,_LENGTH> *)(pAVar11 + -4))->_M_elems[0] = (void **)p;
        pAVar11->_M_elems[0] = pAVar11->_M_elems[0] + 1;
        return;
      }
      lVar7 = lVar7 + 1;
      pAVar11 = pAVar11 + 0xc;
    } while (lVar7 == 1);
    uVar6 = 0;
    uVar12 = uVar8;
    uVar15 = uVar8;
    lVar7 = 0;
    do {
      uVar2 = (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar15];
      uVar13 = uVar15;
      if (uVar2 != 0) {
        uVar1 = *(ushort *)
                 ((long)(this->remote_dealloc_cache).batching.open_builder._M_elems[uVar8].length.
                        _M_elems + lVar7);
        bVar16 = uVar6 < uVar1;
        if (uVar6 <= uVar1) {
          uVar6 = uVar1;
        }
        uVar13 = uVar12;
        if (bVar16) {
          uVar13 = uVar15;
        }
      }
      if (uVar2 == 0) break;
      uVar15 = uVar15 + 1;
      bVar16 = lVar7 == 0;
      uVar12 = uVar13;
      lVar7 = lVar7 + 0x18;
    } while (bVar16);
    if ((this->remote_dealloc_cache).batching.open_meta._M_elems[uVar13] != 0) {
      uVar6 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].length._M_elems[0]
      ;
      pvVar3 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].head._M_elems[0];
      ppvVar4 = (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].end._M_elems[0];
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].end._M_elems[0] =
           (void **)((this->remote_dealloc_cache).batching.open_builder._M_elems + uVar13);
      (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].length._M_elems[0] = 0;
      *ppvVar4 = (void *)0x0;
      ppvVar4[1] = (void *)0x0;
      *ppvVar4 = (void *)(((long)pvVar3 - (long)ppvVar4) * 0x800 + (ulong)uVar6);
      uVar14 = *(uint *)((long)&((snmalloc::
                                  BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>
                                  ::concretePagemap.body)->
                                super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                                ).super_MetaEntryBase.remote_and_sizeclass +
                        ((ulong)ppvVar4 >> 10 & 0xfffffffffffffff0)) >> 0xe & 0xff;
      *(this->remote_dealloc_cache).list._M_elems[uVar14].end._M_elems[0] = ppvVar4 + 1;
      (this->remote_dealloc_cache).list._M_elems[uVar14].end._M_elems[0] = ppvVar4 + 1;
      (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar13] = 0;
    }
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].end._M_elems[0] =
         (void **)((this->remote_dealloc_cache).batching.open_builder._M_elems + uVar13);
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].length._M_elems[0] = 0;
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].head._M_elems[0] =
         (void *)0x0;
    (this->remote_dealloc_cache).batching.open_meta._M_elems[uVar13] = uVar5;
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].head._M_elems[0] = p;
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].end._M_elems[0] = (void **)p
    ;
    (this->remote_dealloc_cache).batching.open_builder._M_elems[uVar13].length._M_elems[0] = 1;
  }
  return;
}

Assistant:

void operator delete(void* p) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}